

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O2

err_t stb99ParamsGen(stb99_params *params,stb99_seed *seed)

{
  word *b;
  word *p;
  word *r;
  qr_o *r_00;
  u64 *puVar1;
  octet *buf;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  err_t eVar5;
  bool_t bVar6;
  size_t *psVar7;
  ulong m;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  blob_t state;
  size_t sVar16;
  word *a;
  ulong no;
  long lVar17;
  ulong uVar18;
  ulong n;
  ulong uVar19;
  void *stack;
  long lStack_b0;
  
  eVar5 = stb99SeedVal(seed);
  if (eVar5 == 0) {
    bVar6 = memIsValid(params,0x3d0);
    if (bVar6 == 0) {
      eVar5 = 0x6d;
    }
    else {
      memSet(params,'\0',0x3d0);
      sVar16 = seed->l;
      params->l = sVar16;
      for (lVar17 = 0; (lVar17 != 0x50 && (*(size_t *)((long)_ls + lVar17) != sVar16));
          lVar17 = lVar17 + 8) {
      }
      sVar2 = *(size_t *)((long)_rs + lVar17);
      params->r = sVar2;
      uVar18 = seed->ri[0] + 0x3f >> 6;
      psVar7 = seed->ri;
      while( true ) {
        psVar7 = psVar7 + 1;
        if (*psVar7 < 0x21) break;
        uVar18 = uVar18 + (*psVar7 + 0x3f >> 6);
      }
      uVar19 = seed->di[0] + 0x3f >> 6;
      lVar17 = 10;
      while (0x20 < *(ulong *)(seed->zi + lVar17 * 4 + -4)) {
        uVar19 = uVar19 + (*(ulong *)(seed->zi + lVar17 * 4 + -4) + 0x3f >> 6);
        lVar17 = lVar17 + 1;
      }
      n = sVar16 + 0x3f >> 6;
      no = sVar16 + 7 >> 3;
      m = sVar2 + 0x3f >> 6;
      sVar8 = prngSTB_keep();
      sVar16 = seed->di[0];
      sVar9 = zmMontCreate_keep(no);
      sVar10 = priNextPrimeW_deep();
      sVar11 = priExtendPrime_deep(params->l,seed->di[1] + 0x3f >> 6,seed->di[0] + 3 >> 2);
      sVar12 = priExtendPrime2_deep
                         (params->l,seed->di[0] + 0x3f >> 6,seed->ri[0] + 0x3f >> 6,
                          params->l + 3 >> 2);
      sVar13 = zmMontCreate_deep(no);
      sVar14 = zzDiv_deep(n,m);
      sVar15 = zmMontCreate_deep(no);
      sVar15 = qrPower_deep(n,n,sVar15);
      sVar10 = utilMax(6,sVar10,sVar11,sVar12,sVar13,sVar14,sVar15);
      state = blobCreate(sVar9 + sVar8 + n * 0x10 + uVar19 * 8 + 8 + (sVar16 + 0x3f >> 6) * 8 +
                         sVar10);
      if (state != (blob_t)0x0) {
        lVar17 = lVar17 + -9;
        sVar16 = prngSTB_keep();
        a = (word *)(sVar16 + (long)state);
        b = a + uVar19 + 1;
        p = b + (seed->di[0] + 0x3f >> 6);
        r = p + n;
        r_00 = (qr_o *)(r + n);
        sVar16 = zmMontCreate_keep(no);
        stack = (void *)((long)&(r_00->hdr).keep + sVar16);
        prngSTBStart(state,seed->zi);
        do {
          while( true ) {
            uVar3 = seed->di[lVar17];
            puVar1 = a + uVar19;
            if (uVar3 < 0x21) break;
            sVar8 = uVar3 + 3 >> 2;
            sVar16 = priBaseSize();
            if (sVar16 < sVar8) {
              sVar8 = priBaseSize();
            }
            bVar6 = priExtendPrime(puVar1,seed->di[lVar17],puVar1 + (seed->di[lVar17] + 0x3f >> 6),
                                   seed->di[lVar17 + 1] + 0x3f >> 6,uVar3 << 2,sVar8,prngSTBStepR,
                                   state,stack);
            if (bVar6 != 0) goto LAB_00139569;
            psVar7 = seed->di + lVar17;
            lVar17 = lVar17 + 1;
            uVar19 = uVar19 + (*psVar7 + 0x3f >> 6);
          }
          do {
            prngSTBStepR(puVar1,seed->di[lVar17] + 7 >> 3,state);
            u64From(puVar1,puVar1,seed->di[lVar17] + 7 >> 3);
            wwTrimHi(puVar1,1,seed->di[lVar17] - 1);
            wwSetBit(puVar1,seed->di[lVar17] - 1,1);
            bVar6 = priNextPrimeW(puVar1,*puVar1,stack);
          } while (bVar6 == 0);
LAB_00139569:
          if (lVar17 == 0) {
            wwCopy(b,a,seed->di[0] + 0x3f >> 6);
            lStack_b0 = 1;
            do {
              do {
                lVar17 = lStack_b0;
                sVar16 = seed->ri[lVar17];
                lStack_b0 = lVar17 + 1;
                uVar19 = uVar18;
              } while (0x20 < sVar16);
LAB_001395eb:
              while (puVar1 = a + uVar19, 0x20 < sVar16) {
                sVar9 = sVar16 + 3 >> 2;
                sVar8 = priBaseSize();
                if (sVar8 < sVar9) {
                  sVar9 = priBaseSize();
                }
                bVar6 = priExtendPrime(puVar1,seed->ri[lVar17],
                                       puVar1 + (seed->ri[lVar17] + 0x3f >> 6),
                                       seed->ri[lVar17 + 1] + 0x3f >> 6,sVar16 << 2,sVar9,
                                       prngSTBStepR,state,stack);
                if (bVar6 != 0) goto LAB_0013970a;
                psVar7 = seed->ri + lVar17;
                lVar4 = lVar17 + 1;
                lVar17 = lVar17 + 1;
                uVar19 = uVar19 + (*psVar7 + 0x3f >> 6);
                sVar16 = seed->ri[lVar4];
              }
              do {
                prngSTBStepR(puVar1,seed->ri[lVar17] + 7 >> 3,state);
                u64From(puVar1,puVar1,seed->ri[lVar17] + 7 >> 3);
                wwTrimHi(puVar1,1,seed->ri[lVar17] - 1);
                wwSetBit(puVar1,seed->ri[lVar17] - 1,1);
                bVar6 = priNextPrimeW(puVar1,*puVar1,stack);
              } while (bVar6 == 0);
LAB_0013970a:
              if (lVar17 != 0) {
                sVar16 = seed->ri[lVar17 + -1];
                lVar17 = lVar17 + -1;
                uVar19 = uVar19 - (sVar16 + 0x3f >> 6);
                goto LAB_001395eb;
              }
              sVar16 = seed->di[0];
              sVar9 = sVar16 + 3 >> 2;
              sVar8 = priBaseSize();
              if (sVar8 < sVar9) {
                sVar9 = priBaseSize();
              }
              bVar6 = priExtendPrime2(p,params->l,b,seed->di[0] + 0x3f >> 6,a,
                                      seed->ri[0] + 0x3f >> 6,sVar16 << 2,sVar9,prngSTBStepR,state,
                                      stack);
              lStack_b0 = 1;
              if (bVar6 != 0) {
                u64To(params->p,no,p);
                u64To(params->q,sVar2 + 7 >> 3,a);
                zmMontCreate(r_00,params->p,no,params->l + 2,stack);
                zzSubW2(p,n,1);
                zzDiv(p,r,p,n,a,m,stack);
                buf = params->d;
                memSet(buf,'\0',no);
                params->d[0] = '\x05';
                (*(code *)r[n + 8])(a,buf,r_00,stack);
                while( true ) {
                  qrPower(r,a,p,(n - m) + 1,r_00,stack);
                  bVar6 = wwEq(r,r_00->unity,r_00->n);
                  if (bVar6 == 0) break;
                  zzAddWMod(a,a,1,r_00->mod,n);
                }
                u64To(params->a,no,r);
                u64To(buf,no,a);
                blobClose(state);
                return 0;
              }
            } while( true );
          }
          lVar4 = lVar17 + -1;
          lVar17 = lVar17 + -1;
          uVar19 = uVar19 - (seed->di[lVar4] + 0x3f >> 6);
        } while( true );
      }
      eVar5 = 0x6e;
    }
  }
  return eVar5;
}

Assistant:

err_t stb99ParamsGen(stb99_params* params, const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t n, no;
	size_t m, mo;
	size_t gw;			/* число слов для хранения gi */
	size_t fw;			/* число слов для хранения fi */
	size_t offset;
	size_t trials;
	size_t base_count;
	// состояние 
	void* state;
	octet* stb_state;
	word* gi;			/* промежуточные простые при построении g0 */
	word* fi;			/* промежуточные простые при построении q */
	word* g0;
	word* p;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить seed
	code = stb99SeedVal(seed);
	ERR_CALL_CHECK(code);
	// подготовить params
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	memSetZero(params, sizeof(stb99_params));
	params->l = seed->l;
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == params->l)
			break;
	ASSERT(i != COUNT_OF(_ls));
	params->r = _rs[i];
	// определить fw
	for (i = 1, fw = W_OF_B(seed->ri[0]); seed->ri[i] > 32; ++i)
		fw += W_OF_B(seed->ri[i]);
	ASSERT(seed->ri[i] > 16);
	ASSERT(W_OF_B(seed->ri[i]) == 1);
	fw += 1;
	// определить gw
	for (i = 1, gw = W_OF_B(seed->di[0]); seed->di[i] > 32; ++i)
		gw += W_OF_B(seed->di[i]);
	ASSERT(seed->di[i] > 16);
	ASSERT(W_OF_B(seed->di[i]) == 1);
	gw += 1;
	ASSERT(gw > fw);
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	ASSERT(n <= gw);
	// создать состояние
	state = blobCreate(
		prngSTB_keep() + O_OF_W(gw) +
		O_OF_W(W_OF_B(seed->di[0]) + 2 * n) + zmMontCreate_keep(no) +
		utilMax(6,
			priNextPrimeW_deep(),
			priExtendPrime_deep(params->l, W_OF_B(seed->di[1]),
				(seed->di[0] + 3) / 4),
			priExtendPrime2_deep(params->l, W_OF_B(seed->di[0]),
				W_OF_B(seed->ri[0]), (params->l + 3) / 4),
			zmMontCreate_deep(no),
			zzDiv_deep(n, m),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	stb_state = (octet*)state;
	fi = gi = d = (word*)(stb_state + prngSTB_keep());
	g0 = gi + gw;
	p = g0 + W_OF_B(seed->di[0]);
	a = p + n;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// запустить генератор
	prngSTBStart(stb_state, seed->zi);
	// построить цепочку gi
	offset = gw - 1;
	while (1)
	{
		// первое (минимальное) gi?
		if (seed->di[i] <= 32)
		{
			ASSERT(offset == gw - 1);
			do
			{
				prngSTBStepR(gi + offset, O_OF_B(seed->di[i]), stb_state);
				wwFrom(gi + offset, gi + offset, O_OF_B(seed->di[i]));
				wwTrimHi(gi + offset, 1, seed->di[i] - 1);
				wwSetBit(gi + offset, seed->di[i] - 1, 1);
			}
			while (!priNextPrimeW(gi + offset, gi[offset], stack));
		}
		// обычное gi
		else
		{
			trials = 4 * seed->di[i];
			base_count = (seed->di[i] + 3) / 4;
			// потенциальное отступление от СТБ, не влияющее на результат
			if (base_count > priBaseSize())
				base_count = priBaseSize();
			// не удается построить новое простое?
			if (!priExtendPrime(gi + offset, seed->di[i],
				gi + offset + W_OF_B(seed->di[i]), W_OF_B(seed->di[i + 1]),
				trials, base_count, prngSTBStepR, stb_state, stack))
			{
				// к предыдущему простому
				offset += W_OF_B(seed->di[i++]);
				continue;
			}
		}
		// последнее простое?
		if (i == 0)
			break;
		// к следующему простому
		offset -= W_OF_B(seed->di[--i]);
	}
	// сохранить g0
	wwCopy(g0, gi, W_OF_B(seed->di[0]));
	// построить цепочку fi
	while (1)
	{
		for (i = 1; seed->ri[i] > 32; ++i);
		offset = fw - 1;
		while (1)
		{
			// первое (минимальное) fi?
			if (seed->ri[i] <= 32)
			{
				ASSERT(offset == fw - 1);
				do
				{
					prngSTBStepR(fi + offset, O_OF_B(seed->ri[i]), stb_state);
					wwFrom(fi + offset, fi + offset, O_OF_B(seed->ri[i]));
					wwTrimHi(fi + offset, 1, seed->ri[i] - 1);
					wwSetBit(fi + offset, seed->ri[i] - 1, 1);
				}
				while (!priNextPrimeW(fi + offset, fi[offset], stack));
			}
			// обычное fi
			else
			{
				trials = 4 * seed->ri[i];
				base_count = (seed->ri[i] + 3) / 4;
				// потенциальное отступление от СТБ, не влияющее на результат
				if (base_count > priBaseSize())
					base_count = priBaseSize();
				// не удается построить новое простое?
				if (!priExtendPrime(fi + offset, seed->ri[i],
					fi + offset + W_OF_B(seed->ri[i]), W_OF_B(seed->ri[i + 1]),
					trials, base_count, prngSTBStepR, stb_state, stack))
				{
					// к предыдущему простому
					offset += W_OF_B(seed->ri[i++]);
					continue;
				}
			}
			// последнее простое?
			if (i == 0)
				break;
			// к следующему простому
			offset -= W_OF_B(seed->ri[--i]);
		}
		// построить p
		trials = 4 * seed->di[0];
		base_count = (seed->di[0] + 3) / 4;
		if (base_count > priBaseSize())
			base_count = priBaseSize();
		if (priExtendPrime2(p, params->l, g0, W_OF_B(seed->di[0]),
			fi, W_OF_B(seed->ri[0]), trials, base_count,
			prngSTBStepR, stb_state, stack))
			break;

	}
	// сохранить p и q
	wwTo(params->p, no, p);
	wwTo(params->q, mo, fi);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// p <- (p - 1) / q
	zzSubW2(p, n, 1);
	zzDiv(p, a, p, n, gi, m, stack);
	// d <- 5
	memSetZero(params->d, no);
	params->d[0] = 5;
	VERIFY(qrFrom(d, params->d, qr, stack));
	// сгенерировать a
	while (1)
	{
		// a <- d^((p - 1)/q)
		qrPower(a, d, p, n - m + 1, qr, stack);
		// a != e?
		if (!qrIsUnity(a, qr))
			break;
		// d <- d + 1
		zzAddWMod(d, d, 1, qr->mod, n);
	}
	// сохранить a и d
	wwTo(params->a, no, a);
	wwTo(params->d, no, d);
	// все нормально
	blobClose(state);
	return ERR_OK;
}